

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeVertexDualAreas
          (IntrinsicGeometryInterface *this)

{
  double dVar1;
  double *pdVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  bool bVar6;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_80;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_68;
  MeshData<geometrycentral::surface::Vertex,_double> local_50;
  
  DependentQuantity::ensureHave(&(this->faceAreasQ).super_DependentQuantity);
  MeshData<geometrycentral::surface::Vertex,_double>::MeshData
            (&local_50,(this->super_BaseGeometryInterface).mesh,0.0);
  MeshData<geometrycentral::surface::Vertex,_double>::operator=(&this->vertexDualAreas,&local_50);
  MeshData<geometrycentral::surface::Vertex,_double>::~MeshData(&local_50);
  local_50.mesh = (this->super_BaseGeometryInterface).mesh;
  local_50.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)(local_50.mesh)->nFacesFillCount;
  local_50.defaultValue = 0.0;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            (&local_80,(RangeSetBase<geometrycentral::surface::FaceRangeF> *)&local_50);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            (&local_68,(RangeSetBase<geometrycentral::surface::FaceRangeF> *)&local_50);
  while (local_80.iCurr != local_68.iCurr) {
    pdVar2 = (this->vertexDualAreas).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    bVar6 = true;
    dVar1 = (this->faceAreas).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data[local_80.iCurr];
    uVar3 = ((local_80.mesh)->fHalfedgeArr).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_80.iCurr];
    for (uVar5 = uVar3; (bVar6 || (uVar5 != uVar3));
        uVar5 = ((local_80.mesh)->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5]) {
      uVar4 = ((local_80.mesh)->heVertexArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      pdVar2[uVar4] = dVar1 / 3.0 + pdVar2[uVar4];
      bVar6 = false;
    }
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++(&local_80);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeVertexDualAreas() {
  faceAreasQ.ensureHave();

  vertexDualAreas = VertexData<double>(mesh, 0.);

  for (Face f : mesh.faces()) {
    double A = faceAreas[f];
    for (Vertex v : f.adjacentVertices()) {
      vertexDualAreas[v] += A / 3.0;
    }
  }
}